

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

size_t bitset_intersection_count(bitset_t *b1,bitset_t *b2)

{
  size_t sVar1;
  ulong uVar2;
  size_t k;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = b2->arraysize;
  if (b1->arraysize < b2->arraysize) {
    uVar2 = b1->arraysize;
  }
  sVar1 = 0;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = b2->array[uVar3] & b1->array[uVar3];
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    sVar1 = sVar1 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  return sVar1;
}

Assistant:

size_t bitset_intersection_count(const bitset_t *CBITSET_RESTRICT b1,
                                 const bitset_t *CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] & b2->array[k]);
    }
    return answer;
}